

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.c
# Opt level: O0

input_t input_routine(tgestate_t *state)

{
  input_t iVar1;
  tgestate_t *in_RDI;
  
  iVar1 = (*input_routine::inputroutines[in_RDI->chosen_input_device])(in_RDI);
  return iVar1;
}

Assistant:

input_t input_routine(tgestate_t *state)
{
  /**
   * $F43D: Available input routines.
   */
  static const inputroutine_t inputroutines[inputdevice__LIMIT] =
  {
    &inputroutine_keyboard,
    &inputroutine_kempston,
    &inputroutine_sinclair,
    &inputroutine_protek,
    /* &inputroutine_fuller -- Present in the game but never used */
  };

  assert(state != NULL);

  assert(state->chosen_input_device < inputdevice__LIMIT);

  return inputroutines[state->chosen_input_device](state);
}